

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

value_type * __thiscall nonstd::optional_lite::optional<int>::value(optional<int> *this)

{
  bad_optional_access *this_00;
  bad_optional_access local_20;
  
  if (this->has_value_ != false) {
    return (value_type *)&this->contained;
  }
  this_00 = (bad_optional_access *)__cxa_allocate_exception(0x10);
  bad_optional_access::bad_optional_access(&local_20);
  bad_optional_access::bad_optional_access(this_00,&local_20);
  __cxa_throw(this_00,&bad_optional_access::typeinfo,std::logic_error::~logic_error);
}

Assistant:

optional_constexpr14 value_type const & value() const optional_ref_qual
    {
#if optional_CONFIG_NO_EXCEPTIONS
        assert( has_value() );
#else
        if ( ! has_value() )
        {
            throw bad_optional_access();
        }
#endif
        return contained.value();
    }